

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_color_quantity.cpp
# Opt level: O3

void __thiscall polyscope::PointCloudColorQuantity::draw(PointCloudColorQuantity *this)

{
  ShaderProgram *p;
  
  if ((this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.enabled.value == true)
  {
    p = (this->pointProgram).
        super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (p == (ShaderProgram *)0x0) {
      createPointProgram(this);
      p = (this->pointProgram).
          super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    Structure::setTransformUniforms
              ((Structure *)
               (this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.parent,p);
    PointCloud::setPointCloudUniforms
              ((this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.parent,
               (this->pointProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    (*((this->pointProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
    return;
  }
  return;
}

Assistant:

void PointCloudColorQuantity::draw() {
  if (!isEnabled()) return;

  // Make the program if we don't have one already
  if (pointProgram == nullptr) {
    createPointProgram();
  }

  parent.setTransformUniforms(*pointProgram);
  parent.setPointCloudUniforms(*pointProgram);

  pointProgram->draw();
}